

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-font.c
# Opt level: O1

float plutovg_font_face_text_extents
                (plutovg_font_face_t *face,float size,void *text,int length,
                plutovg_text_encoding_t encoding,plutovg_rect_t *extents)

{
  ushort uVar1;
  plutovg_codepoint_t codepoint;
  glyph_t *pgVar2;
  plutovg_rect_t *ppVar3;
  bool bVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float advance_width;
  plutovg_rect_t glyph_extents;
  plutovg_text_iterator_t it;
  float local_60;
  float local_5c;
  plutovg_rect_t local_58;
  plutovg_text_iterator_t local_48;
  
  plutovg_text_iterator_init(&local_48,text,length,encoding);
  if (local_48.index < local_48.length) {
    fVar5 = 0.0;
    ppVar3 = (plutovg_rect_t *)0x0;
    do {
      codepoint = plutovg_text_iterator_next(&local_48);
      if (extents == (plutovg_rect_t *)0x0) {
        uVar1 = *(ushort *)((face->info).data + (long)(face->info).head + 0x12);
        local_5c = size / (float)(ushort)(uVar1 << 8 | uVar1 >> 8);
        pgVar2 = plutovg_font_face_get_glyph(face,codepoint);
        local_60 = (float)pgVar2->advance_width * local_5c;
      }
      else {
        plutovg_font_face_get_glyph_metrics(face,size,codepoint,&local_60,(float *)0x0,&local_58);
        local_58.x = local_58.x + fVar5;
        if (ppVar3 == (plutovg_rect_t *)0x0) {
          extents->x = local_58.x;
          extents->y = local_58.y;
          extents->w = local_58.w;
          extents->h = local_58.h;
          ppVar3 = extents;
        }
        else {
          fVar6 = ppVar3->x;
          fVar7 = ppVar3->y;
          fVar8 = fVar6;
          if (local_58.x <= fVar6) {
            fVar8 = local_58.x;
          }
          fVar9 = fVar7;
          if (local_58.y <= fVar7) {
            fVar9 = local_58.y;
          }
          fVar6 = fVar6 + ppVar3->w;
          fVar7 = fVar7 + ppVar3->h;
          if (fVar6 <= local_58.x + local_58.w) {
            fVar6 = local_58.x + local_58.w;
          }
          if (fVar7 <= local_58.y + local_58.h) {
            fVar7 = local_58.y + local_58.h;
          }
          ppVar3->x = fVar8;
          ppVar3->y = fVar9;
          ppVar3->w = fVar6 - fVar8;
          ppVar3->h = fVar7 - fVar9;
        }
      }
      fVar5 = fVar5 + local_60;
    } while (local_48.index < local_48.length);
    bVar4 = ppVar3 != (plutovg_rect_t *)0x0;
  }
  else {
    fVar5 = 0.0;
    bVar4 = false;
  }
  if (extents != (plutovg_rect_t *)0x0 && !bVar4) {
    extents->x = 0.0;
    extents->y = 0.0;
    extents->w = 0.0;
    extents->h = 0.0;
  }
  return fVar5;
}

Assistant:

float plutovg_font_face_text_extents(plutovg_font_face_t* face, float size, const void* text, int length, plutovg_text_encoding_t encoding, plutovg_rect_t* extents)
{
    plutovg_text_iterator_t it;
    plutovg_text_iterator_init(&it, text, length, encoding);
    plutovg_rect_t* text_extents = NULL;
    float total_advance_width = 0.f;
    while(plutovg_text_iterator_has_next(&it)) {
        plutovg_codepoint_t codepoint = plutovg_text_iterator_next(&it);

        float advance_width;
        if(extents == NULL) {
            plutovg_font_face_get_glyph_metrics(face, size, codepoint, &advance_width, NULL, NULL);
            total_advance_width += advance_width;
            continue;
        }

        plutovg_rect_t glyph_extents;
        plutovg_font_face_get_glyph_metrics(face, size, codepoint, &advance_width, NULL, &glyph_extents);

        glyph_extents.x += total_advance_width;
        total_advance_width += advance_width;
        if(text_extents == NULL) {
            text_extents = extents;
            *text_extents = glyph_extents;
            continue;
        }

        float x1 = plutovg_min(text_extents->x, glyph_extents.x);
        float y1 = plutovg_min(text_extents->y, glyph_extents.y);
        float x2 = plutovg_max(text_extents->x + text_extents->w, glyph_extents.x + glyph_extents.w);
        float y2 = plutovg_max(text_extents->y + text_extents->h, glyph_extents.y + glyph_extents.h);

        text_extents->x = x1;
        text_extents->y = y1;
        text_extents->w = x2 - x1;
        text_extents->h = y2 - y1;
    }

    if(extents && !text_extents) {
        extents->x = 0;
        extents->y = 0;
        extents->w = 0;
        extents->h = 0;
    }

    return total_advance_width;
}